

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# median.h
# Opt level: O3

unsigned_short pseudo_median<unsigned_short>(unsigned_short *begin,unsigned_short *end)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  ulong uVar7;
  long lVar8;
  
  lVar8 = (long)end - (long)begin;
  if ((ulong)(lVar8 >> 1) < 4) {
    __assert_fail("N>3",
                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/util/median.h"
                  ,0x41,"CharT pseudo_median(CharT *, CharT *) [CharT = unsigned short]");
  }
  uVar4 = *begin;
  uVar1 = begin[1];
  uVar5 = uVar4;
  if ((uVar4 != uVar1) && (uVar3 = begin[2], uVar5 = uVar3, uVar3 != uVar1 && uVar3 != uVar4)) {
    uVar5 = uVar1;
    if (uVar4 < uVar1) {
      if ((uVar3 <= uVar1) && (uVar5 = uVar3, uVar3 < uVar4)) {
        uVar5 = uVar4;
      }
    }
    else if ((uVar1 <= uVar3) && (uVar5 = uVar3, uVar4 < uVar3)) {
      uVar5 = uVar4;
    }
  }
  uVar7 = lVar8 >> 1 & 0xfffffffffffffffe;
  uVar4 = *(ushort *)((long)begin + uVar7);
  uVar1 = *(ushort *)((long)begin + uVar7 + 2);
  uVar3 = uVar4;
  if ((uVar4 != uVar1) &&
     (uVar6 = *(ushort *)((long)begin + uVar7 + 4), uVar3 = uVar6, uVar6 != uVar1 && uVar6 != uVar4)
     ) {
    uVar3 = uVar1;
    if (uVar4 < uVar1) {
      if ((uVar6 <= uVar1) && (uVar3 = uVar6, uVar6 < uVar4)) {
        uVar3 = uVar4;
      }
    }
    else if ((uVar1 <= uVar6) && (uVar3 = uVar6, uVar4 < uVar6)) {
      uVar3 = uVar4;
    }
  }
  uVar4 = *(ushort *)((long)begin + lVar8 + -6);
  uVar1 = *(ushort *)((long)begin + lVar8 + -4);
  uVar6 = uVar4;
  if ((uVar4 != uVar1) &&
     (uVar2 = *(ushort *)((long)begin + lVar8 + -2), uVar6 = uVar2, uVar2 != uVar1 && uVar2 != uVar4
     )) {
    uVar6 = uVar1;
    if (uVar4 < uVar1) {
      if ((uVar2 <= uVar1) && (uVar6 = uVar2, uVar2 < uVar4)) {
        uVar6 = uVar4;
      }
    }
    else if ((uVar1 <= uVar2) && (uVar6 = uVar2, uVar4 < uVar2)) {
      uVar6 = uVar4;
    }
  }
  if (uVar5 != uVar3) {
    uVar4 = uVar6;
    if ((uVar6 != uVar5) && (uVar6 != uVar3)) {
      uVar4 = uVar3;
      if (uVar5 < uVar3) {
        if ((uVar6 <= uVar3) && (uVar4 = uVar6, uVar6 < uVar5)) {
          uVar4 = uVar5;
        }
      }
      else if ((uVar3 <= uVar6) && (uVar4 = uVar6, uVar5 < uVar6)) {
        uVar4 = uVar5;
      }
    }
    return uVar4;
  }
  return uVar5;
}

Assistant:

inline CharT
pseudo_median(CharT* begin, CharT* end)
{
	size_t N=end-begin;
	assert(N>3);
	return med3char(
			med3char(begin[0],   begin[1],     begin[2]),
			med3char(begin[N/2], begin[N/2+1], begin[N/2+2]),
			med3char(begin[N-3], begin[N-2],   begin[N-1])
		       );
}